

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_iso9660.c
# Opt level: O1

int set_directory_record
              (uchar *p,size_t n,isoent *isoent,iso9660_conflict *iso9660,dir_rec_type t,
              vdd_type vdd_type)

{
  int *piVar1;
  extr_rec *peVar2;
  dir_rec_type dVar3;
  mode_t mVar4;
  uint uVar5;
  uint32_t uVar6;
  int iVar7;
  wchar_t wVar8;
  isoent *piVar9;
  time_t tVar10;
  int64_t iVar11;
  int64_t iVar12;
  content_conflict *pcVar13;
  time_t tVar14;
  dev_t dVar15;
  uchar uVar16;
  isofile *piVar17;
  ulong uVar18;
  byte bVar19;
  byte bVar20;
  uchar uVar21;
  uint32_t *puVar22;
  byte *pbVar23;
  bool bVar24;
  int iVar25;
  long lVar26;
  byte *pbVar27;
  uchar uVar28;
  byte *pbVar29;
  uchar uVar30;
  byte *pbVar31;
  uchar *puVar32;
  byte bVar33;
  size_t __n;
  ulong uVar34;
  char *__src;
  uchar *puVar35;
  size_t __n_00;
  ctl_extr_rec ctl;
  byte local_a9;
  ctl_extr_rec local_a8;
  dir_rec_type local_6c;
  isofile *local_68;
  isoent *local_60;
  iso9660_conflict *local_58;
  isoent *local_50;
  isoent *local_48;
  isoent *local_40;
  uchar *local_38;
  
  local_58 = iso9660;
  if (p != (uchar *)0x0) {
    lVar26 = 0x98;
    if (t < DIR_REC_NORMAL) {
      lVar26 = (ulong)t * 4 + 0x8c;
    }
    if (n < (ulong)(long)*(int *)((long)(isoent->rbnode).rb_nodes + lVar26)) {
      return 0;
    }
  }
  __n = 1;
  if ((t == DIR_REC_NORMAL) && (isoent->identifier != (char *)0x0)) {
    __n = (size_t)isoent->id_len;
  }
  local_6c = t;
  local_60 = isoent;
  if (p == (uchar *)0x0) {
    puVar35 = (uchar *)0x0;
  }
  else {
    piVar9 = isoent;
    if (t == DIR_REC_PARENT) {
      piVar9 = isoent->parent;
    }
    piVar17 = isoent->file->hardlink_target;
    if (piVar17 == (isofile *)0x0) {
      piVar17 = isoent->file;
    }
    uVar28 = '\x02';
    if ((piVar9->field_0xe8 & 2) == 0) {
      uVar28 = (piVar17->cur_content->next != (content_conflict *)0x0) << 7;
    }
    p[1] = '\0';
    if ((piVar9->field_0xe8 & 2) == 0) {
      puVar22 = &piVar17->cur_content->location;
    }
    else {
      puVar22 = &piVar9->dir_location;
    }
    uVar6 = *puVar22;
    p[2] = (uchar)uVar6;
    uVar16 = (uchar)(uVar6 >> 8);
    p[3] = uVar16;
    uVar21 = (uchar)(uVar6 >> 0x10);
    p[4] = uVar21;
    uVar30 = (uchar)(uVar6 >> 0x18);
    p[5] = uVar30;
    p[6] = uVar30;
    p[7] = uVar21;
    p[8] = uVar16;
    p[9] = (uchar)uVar6;
    if ((piVar9->field_0xe8 & 2) == 0) {
      iVar11 = piVar17->cur_content->size;
      p[10] = (uchar)iVar11;
      uVar16 = (uchar)((ulong)iVar11 >> 8);
      p[0xb] = uVar16;
      uVar21 = (uchar)((ulong)iVar11 >> 0x10);
      p[0xc] = uVar21;
      uVar30 = (uchar)((ulong)iVar11 >> 0x18);
    }
    else {
      uVar5 = piVar9->dir_block;
      p[10] = '\0';
      uVar16 = (char)uVar5 * '\b';
      p[0xb] = uVar16;
      uVar21 = (uchar)(uVar5 >> 5);
      p[0xc] = uVar21;
      uVar30 = (uchar)(uVar5 >> 0xd);
      iVar11 = 0;
    }
    puVar35 = p + -1;
    p[0xd] = uVar30;
    p[0xe] = uVar30;
    p[0xf] = uVar21;
    p[0x10] = uVar16;
    p[0x11] = (uchar)iVar11;
    tVar10 = archive_entry_mtime(piVar9->file->entry);
    set_time_915(p + 0x12,tVar10);
    isoent = local_60;
    t = local_6c;
    p[0x19] = uVar28;
    p[0x1a] = '\0';
    p[0x1b] = '\0';
    iVar25 = local_58->volume_sequence_number;
    uVar28 = (uchar)iVar25;
    p[0x1c] = uVar28;
    uVar16 = (uchar)((uint)iVar25 >> 8);
    p[0x1d] = uVar16;
    p[0x1e] = uVar16;
    p[0x1f] = uVar28;
    p[0x20] = (uchar)__n;
    if (local_6c < DIR_REC_PARENT) {
      p[0x21] = '\0';
    }
    else if (local_6c == DIR_REC_PARENT) {
      p[0x21] = '\x01';
    }
    else if (local_60->identifier == (char *)0x0) {
      p[0x21] = '\0';
    }
    else {
      memcpy(p + 0x21,local_60->identifier,__n);
    }
  }
  uVar34 = __n + 0x21;
  if (((uVar34 & 1) != 0) && (uVar34 = __n + 0x22, p != (uchar *)0x0)) {
    puVar35[uVar34] = '\0';
  }
  local_a8.dr_len = (int)uVar34;
  if (t == DIR_REC_VD) {
    if (p == (uchar *)0x0) {
      (isoent->dr_len).vd = local_a8.dr_len;
      return local_a8.dr_len;
    }
  }
  else {
    if ((vdd_type != VDD_JOLIET) && (((uint)local_58->opt & 0x1800000) != 0)) {
      puVar32 = puVar35 + local_a8.dr_len;
      if (puVar35 == (uchar *)0x0) {
        puVar32 = (uchar *)0x0;
      }
      local_a8.bp = puVar35;
      local_a8.use_extr = 0;
      local_a8.isoent = isoent;
      local_a8.ce_ptr = (uchar *)0x0;
      local_a8.limit = 0xe2;
      if (t == DIR_REC_PARENT) {
        local_40 = isoent->rr_parent;
        local_48 = isoent->parent;
        piVar9 = local_40;
        if (local_40 == (isoent *)0x0) {
          piVar9 = isoent->parent;
        }
      }
      else {
        local_40 = (isoent *)0x0;
        local_48 = isoent;
        piVar9 = isoent;
      }
      piVar17 = piVar9->file;
      local_a8.cur_len = local_a8.dr_len;
      if (t == DIR_REC_NORMAL) {
        mVar4 = archive_entry_filetype(piVar17->entry);
        bVar19 = (piVar9->rr_child != (isoent *)0x0) << 4 |
                 (piVar9->rr_parent != (isoent *)0x0) << 6 | (mVar4 == 0xa000) << 2;
        bVar20 = bVar19 | 0x89;
        mVar4 = archive_entry_filetype(piVar17->entry);
        if ((mVar4 == 0x2000) || (mVar4 = archive_entry_filetype(piVar17->entry), mVar4 == 0x6000))
        {
          bVar20 = bVar19 | 0x8b;
        }
      }
      else {
        bVar20 = (local_40 != (isoent *)0x0) << 5 | 0x81;
      }
      if ((t == DIR_REC_SELF) && (piVar9 == piVar9->parent)) {
        if (puVar32 == (uchar *)0x0) {
          puVar32 = (uchar *)0x0;
        }
        else {
          puVar32[1] = 'S';
          puVar32[2] = 'P';
          puVar32[3] = '\a';
          puVar32[4] = '\x01';
          puVar32[5] = 0xbe;
          puVar32[6] = 0xef;
          puVar32[7] = '\0';
          puVar32 = puVar32 + 7;
        }
        if ((local_a8.use_extr != 0) &&
           (peVar2 = ((local_a8.isoent)->parent->extr_rec_list).current, peVar2 != (extr_rec *)0x0))
        {
          piVar1 = &peVar2->offset;
          *piVar1 = *piVar1 + 7;
        }
        local_a8.cur_len = local_a8.cur_len + 7;
      }
      if (local_a8.limit - local_a8.cur_len < 5) {
        puVar32 = extra_next_record(&local_a8,5);
      }
      if (puVar32 == (uchar *)0x0) {
        puVar32 = (uchar *)0x0;
      }
      else {
        puVar32[1] = 'R';
        puVar32[2] = 'R';
        puVar32[3] = '\x05';
        puVar32[4] = '\x01';
        puVar32[5] = bVar20;
        puVar32 = puVar32 + 5;
      }
      if ((local_a8.use_extr != 0) &&
         (peVar2 = ((local_a8.isoent)->parent->extr_rec_list).current, peVar2 != (extr_rec *)0x0)) {
        piVar1 = &peVar2->offset;
        *piVar1 = *piVar1 + 5;
      }
      local_a8.cur_len = local_a8.cur_len + 5;
      local_50 = piVar9;
      local_68 = piVar17;
      if ((bVar20 & 8) != 0) {
        __src = (piVar17->basename).s;
        __n_00 = (piVar17->basename).length;
        if (local_a8.limit - local_a8.cur_len < 6) {
          puVar32 = extra_next_record(&local_a8,6);
        }
        if (puVar32 != (uchar *)0x0) {
          puVar32[1] = 'N';
          puVar32[2] = 'M';
          puVar32[4] = '\x01';
        }
        uVar5 = local_a8.limit - local_a8.cur_len;
        if (0xfe < (uint)(local_a8.limit - local_a8.cur_len)) {
          uVar5 = 0xff;
        }
        uVar34 = (ulong)uVar5;
        if (uVar34 < __n_00 + 5) {
          do {
            if (puVar32 == (uchar *)0x0) {
              puVar32 = (uchar *)0x0;
            }
            else {
              puVar32[3] = (uchar)uVar34;
              puVar32[5] = '\x01';
              memcpy(puVar32 + 6,__src,(long)((uVar34 << 0x20) + -0x500000000) >> 0x20);
              puVar32 = puVar32 + uVar34;
            }
            if ((local_a8.use_extr != 0) &&
               (peVar2 = ((local_a8.isoent)->parent->extr_rec_list).current,
               peVar2 != (extr_rec *)0x0)) {
              piVar1 = &peVar2->offset;
              *piVar1 = *piVar1 + (int)uVar34;
            }
            local_a8.cur_len = local_a8.cur_len + (int)uVar34;
            uVar18 = uVar34;
            if (local_a8.limit - local_a8.cur_len < 6) {
              puVar32 = extra_next_record(&local_a8,6);
              uVar18 = (ulong)(uint)(local_a8.limit - local_a8.cur_len);
              if (0xfe < (uint)(local_a8.limit - local_a8.cur_len)) {
                uVar18 = 0xff;
              }
            }
            if (puVar32 != (uchar *)0x0) {
              puVar32[1] = 'N';
              puVar32[2] = 'M';
              puVar32[4] = '\x01';
            }
            lVar26 = (long)((uVar34 << 0x20) + -0x500000000) >> 0x20;
            __n_00 = __n_00 - lVar26;
            __src = __src + lVar26;
            uVar34 = uVar18;
          } while (uVar18 < __n_00 + 5);
        }
        iVar25 = (int)__n_00 + 5;
        if (puVar32 == (uchar *)0x0) {
          puVar32 = (uchar *)0x0;
        }
        else {
          puVar32[3] = (uchar)iVar25;
          puVar32[5] = '\0';
          memcpy(puVar32 + 6,__src,__n_00);
          puVar32 = puVar32 + iVar25;
        }
        if ((local_a8.use_extr != 0) &&
           (peVar2 = ((local_a8.isoent)->parent->extr_rec_list).current, peVar2 != (extr_rec *)0x0))
        {
          piVar1 = &peVar2->offset;
          *piVar1 = *piVar1 + iVar25;
        }
        local_a8.cur_len = local_a8.cur_len + iVar25;
      }
      piVar17 = local_68;
      if ((bVar20 & 1) != 0) {
        if (local_a8.limit - local_a8.cur_len < 0x2c) {
          puVar32 = extra_next_record(&local_a8,0x2c);
        }
        if (puVar32 == (uchar *)0x0) {
          puVar32 = (uchar *)0x0;
        }
        else {
          mVar4 = archive_entry_mode(piVar17->entry);
          iVar11 = archive_entry_uid(piVar17->entry);
          iVar12 = archive_entry_gid(piVar17->entry);
          piVar17 = local_68;
          if (((uint)local_58->opt & 0x1800000) == 0x1000000) {
            uVar5 = 0x16d;
            if ((mVar4 & 0x49) == 0) {
              uVar5 = 0x124;
            }
            mVar4 = mVar4 & 0xfffff049 | uVar5;
          }
          puVar32[1] = 'P';
          puVar32[2] = 'X';
          puVar32[3] = ',';
          puVar32[4] = '\x01';
          puVar32[5] = (uchar)mVar4;
          uVar28 = (uchar)(mVar4 >> 8);
          puVar32[6] = uVar28;
          uVar16 = (uchar)(mVar4 >> 0x10);
          puVar32[7] = uVar16;
          uVar21 = (uchar)(mVar4 >> 0x18);
          puVar32[8] = uVar21;
          puVar32[9] = uVar21;
          puVar32[10] = uVar16;
          puVar32[0xb] = uVar28;
          puVar32[0xc] = (uchar)mVar4;
          uVar5 = archive_entry_nlink(local_68->entry);
          puVar32[0xd] = (uchar)uVar5;
          uVar28 = (uchar)(uVar5 >> 8);
          puVar32[0xe] = uVar28;
          uVar16 = (uchar)(uVar5 >> 0x10);
          puVar32[0xf] = uVar16;
          uVar21 = (uchar)(uVar5 >> 0x18);
          puVar32[0x10] = uVar21;
          puVar32[0x11] = uVar21;
          puVar32[0x12] = uVar16;
          puVar32[0x13] = uVar28;
          puVar32[0x14] = (uchar)uVar5;
          puVar32[0x15] = (uchar)iVar11;
          uVar28 = (uchar)((ulong)iVar11 >> 8);
          puVar32[0x16] = uVar28;
          uVar16 = (uchar)((ulong)iVar11 >> 0x10);
          puVar32[0x17] = uVar16;
          uVar21 = (uchar)((ulong)iVar11 >> 0x18);
          puVar32[0x18] = uVar21;
          puVar32[0x19] = uVar21;
          puVar32[0x1a] = uVar16;
          puVar32[0x1b] = uVar28;
          puVar32[0x1c] = (uchar)iVar11;
          puVar32[0x1d] = (uchar)iVar12;
          uVar28 = (uchar)((ulong)iVar12 >> 8);
          puVar32[0x1e] = uVar28;
          uVar16 = (uchar)((ulong)iVar12 >> 0x10);
          puVar32[0x1f] = uVar16;
          uVar21 = (uchar)((ulong)iVar12 >> 0x18);
          puVar32[0x20] = uVar21;
          puVar32[0x21] = uVar21;
          puVar32[0x22] = uVar16;
          puVar32[0x23] = uVar28;
          puVar32[0x24] = (uchar)iVar12;
          if ((local_48->field_0xe8 & 2) == 0) {
            if (piVar17->hardlink_target == (isofile *)0x0) {
              pcVar13 = piVar17->cur_content;
            }
            else {
              pcVar13 = piVar17->hardlink_target->cur_content;
            }
            uVar6 = pcVar13->location;
          }
          else {
            uVar6 = local_48->dir_location;
          }
          puVar32[0x25] = (uchar)uVar6;
          uVar28 = (uchar)(uVar6 >> 8);
          puVar32[0x26] = uVar28;
          uVar16 = (uchar)(uVar6 >> 0x10);
          puVar32[0x27] = uVar16;
          uVar21 = (uchar)(uVar6 >> 0x18);
          puVar32[0x28] = uVar21;
          puVar32[0x29] = uVar21;
          puVar32[0x2a] = uVar16;
          puVar32[0x2b] = uVar28;
          puVar32[0x2c] = (uchar)uVar6;
          puVar32 = puVar32 + 0x2c;
        }
        if ((local_a8.use_extr != 0) &&
           (peVar2 = ((local_a8.isoent)->parent->extr_rec_list).current, peVar2 != (extr_rec *)0x0))
        {
          piVar1 = &peVar2->offset;
          *piVar1 = *piVar1 + 0x2c;
        }
        local_a8.cur_len = local_a8.cur_len + 0x2c;
      }
      if ((bVar20 & 4) != 0) {
        if (local_a8.limit - local_a8.cur_len < 7) {
          puVar32 = extra_next_record(&local_a8,7);
        }
        pbVar27 = (byte *)(piVar17->symlink).s;
        if (puVar32 != (uchar *)0x0) {
          puVar32[1] = 'S';
          puVar32[2] = 'L';
          puVar32[4] = '\x01';
        }
        bVar19 = 0;
        do {
          iVar7 = local_a8.limit - local_a8.cur_len;
          iVar25 = 0xff;
          if (iVar7 < 0xff) {
            iVar25 = iVar7;
          }
          local_a9 = 0;
          bVar33 = *pbVar27;
          if (iVar7 < 0xc || bVar33 == 0) {
            iVar7 = 5;
            pbVar23 = (byte *)0x0;
          }
          else {
            pbVar29 = puVar32 + 6;
            if (puVar32 == (uchar *)0x0) {
              pbVar29 = (byte *)0x0;
            }
            iVar7 = 0;
            pbVar31 = (byte *)0x0;
            pbVar23 = (byte *)0x0;
            do {
              if (bVar33 == 0x2f && bVar19 == 0) {
                if (pbVar29 == (byte *)0x0) {
                  pbVar31 = (byte *)0x0;
                }
                else {
                  pbVar29[0] = 8;
                  pbVar29[1] = 0;
                  pbVar31 = pbVar29 + 2;
                  pbVar23 = pbVar29;
                }
                pbVar27 = pbVar27 + 1;
                bVar19 = 0x2f;
                pbVar29 = pbVar31;
LAB_0014b453:
                iVar7 = iVar7 + 2;
                pbVar31 = (byte *)0x0;
              }
              else {
                if ((((((bVar19 == 0x2f) || (bVar19 == 0)) && (bVar33 == 0x2e)) &&
                     (pbVar27[1] == 0x2e)) && ((pbVar27[2] == 0 || (pbVar27[2] == 0x2f)))) ||
                   (((bVar33 == 0x2f && ((pbVar27[1] == 0x2e && (pbVar27[2] == 0x2e)))) &&
                    ((pbVar27[3] == 0x2f || (pbVar27[3] == 0)))))) {
                  if (pbVar29 == (byte *)0x0) {
                    pbVar31 = (byte *)0x0;
                  }
                  else {
                    pbVar29[0] = 4;
                    pbVar29[1] = 0;
                    pbVar31 = pbVar29 + 2;
                    pbVar23 = pbVar29;
                  }
                  lVar26 = (ulong)(*pbVar27 == 0x2f) + 2;
LAB_0014b450:
                  pbVar27 = pbVar27 + lVar26;
                  bVar19 = 0x2e;
                  pbVar29 = pbVar31;
                  goto LAB_0014b453;
                }
                if (((((bVar19 == 0x2f) || (bVar19 == 0)) && (bVar33 == 0x2e)) &&
                    ((pbVar27[1] == 0 || (pbVar27[1] == 0x2f)))) ||
                   (((bVar33 == 0x2f && (pbVar27[1] == 0x2e)) &&
                    ((pbVar27[2] == 0x2f || (pbVar27[2] == 0)))))) {
                  if (pbVar29 == (byte *)0x0) {
                    pbVar31 = (byte *)0x0;
                  }
                  else {
                    pbVar29[0] = 2;
                    pbVar29[1] = 0;
                    pbVar31 = pbVar29 + 2;
                    pbVar23 = pbVar29;
                  }
                  lVar26 = (ulong)(*pbVar27 == 0x2f) + 1;
                  goto LAB_0014b450;
                }
                if ((bVar33 == 0x2f) || (pbVar31 == (byte *)0x0)) {
                  if (pbVar29 == (byte *)0x0) {
                    pbVar29 = (byte *)0x0;
                    pbVar31 = &local_a9;
                  }
                  else {
                    pbVar29[0] = 0;
                    pbVar29[1] = 0;
                    pbVar23 = pbVar29;
                    pbVar31 = pbVar29 + 1;
                    pbVar29 = pbVar29 + 2;
                  }
                  iVar7 = iVar7 + 2;
                  if (*pbVar27 != 0x2f) goto LAB_0014b420;
                  pbVar27 = pbVar27 + 1;
                  bVar19 = 0x2f;
                }
                else {
LAB_0014b420:
                  bVar19 = *pbVar27;
                  if (pbVar29 == (byte *)0x0) {
                    pbVar29 = (byte *)0x0;
                  }
                  else {
                    *pbVar29 = bVar19;
                    pbVar29 = pbVar29 + 1;
                    *pbVar31 = *pbVar31 + 1;
                  }
                  pbVar27 = pbVar27 + 1;
                  iVar7 = iVar7 + 1;
                }
              }
              bVar33 = *pbVar27;
            } while ((bVar33 != 0) && (iVar7 + 0xb < iVar25));
            iVar7 = iVar7 + 5;
          }
          if (bVar33 == 0) {
            if (puVar32 == (uchar *)0x0) {
              puVar32 = (uchar *)0x0;
            }
            else {
              puVar32[3] = (uchar)iVar7;
              puVar32[5] = '\0';
              puVar32 = puVar32 + iVar7;
            }
            if ((local_a8.use_extr != 0) &&
               (peVar2 = ((local_a8.isoent)->parent->extr_rec_list).current,
               peVar2 != (extr_rec *)0x0)) {
              piVar1 = &peVar2->offset;
              *piVar1 = *piVar1 + iVar7;
            }
            local_a8.cur_len = local_a8.cur_len + iVar7;
          }
          else {
            if (puVar32 == (uchar *)0x0) {
              puVar32 = (uchar *)0x0;
            }
            else {
              *pbVar23 = *pbVar23 | 1;
              puVar32[3] = (uchar)iVar7;
              puVar32[5] = '\x01';
              puVar32 = puVar32 + iVar7;
            }
            if ((local_a8.use_extr != 0) &&
               (peVar2 = ((local_a8.isoent)->parent->extr_rec_list).current,
               peVar2 != (extr_rec *)0x0)) {
              piVar1 = &peVar2->offset;
              *piVar1 = *piVar1 + iVar7;
            }
            local_a8.cur_len = iVar7 + local_a8.cur_len;
            if (local_a8.limit - local_a8.cur_len < 0xb) {
              puVar32 = extra_next_record(&local_a8,0xb);
            }
            if (puVar32 != (uchar *)0x0) {
              puVar32[1] = 'S';
              puVar32[2] = 'L';
              puVar32[4] = '\x01';
            }
          }
        } while (bVar33 != 0);
      }
      piVar17 = local_68;
      wVar8 = archive_entry_birthtime_is_set(local_68->entry);
      local_38 = p;
      if (wVar8 == L'\0') {
        bVar24 = false;
        iVar25 = 5;
      }
      else {
        tVar10 = archive_entry_birthtime(piVar17->entry);
        tVar14 = archive_entry_mtime(piVar17->entry);
        bVar24 = tVar10 <= tVar14;
        iVar25 = 5;
        if (tVar10 <= tVar14) {
          iVar25 = 0xc;
        }
      }
      wVar8 = archive_entry_mtime_is_set(piVar17->entry);
      iVar7 = iVar25 + 7;
      bVar19 = bVar24 + 2;
      if (wVar8 == L'\0') {
        iVar7 = iVar25;
        bVar19 = bVar24;
      }
      wVar8 = archive_entry_atime_is_set(piVar17->entry);
      bVar33 = bVar19 + 4;
      iVar25 = iVar7 + 7;
      if (wVar8 == L'\0') {
        bVar33 = bVar19;
        iVar25 = iVar7;
      }
      wVar8 = archive_entry_ctime_is_set(piVar17->entry);
      bVar19 = bVar33 | 8;
      iVar7 = iVar25 + 7;
      if (wVar8 == L'\0') {
        bVar19 = bVar33;
        iVar7 = iVar25;
      }
      if (local_a8.limit - local_a8.cur_len < iVar7) {
        puVar32 = extra_next_record(&local_a8,iVar7);
      }
      p = local_38;
      piVar17 = local_68;
      if (puVar32 == (uchar *)0x0) {
        puVar32 = (uchar *)0x0;
      }
      else {
        puVar32[1] = 'T';
        puVar32[2] = 'F';
        puVar32[3] = (uchar)iVar7;
        puVar32[4] = '\x01';
        puVar32[5] = bVar19;
        if ((bVar19 & 1) == 0) {
          puVar32 = puVar32 + 5;
        }
        else {
          tVar10 = archive_entry_birthtime(local_68->entry);
          set_time_915(puVar32 + 6,tVar10);
          puVar32 = puVar32 + 0xc;
        }
        if ((bVar19 & 2) != 0) {
          tVar10 = archive_entry_mtime(piVar17->entry);
          set_time_915(puVar32 + 1,tVar10);
          puVar32 = puVar32 + 7;
        }
        if ((bVar19 & 4) != 0) {
          tVar10 = archive_entry_atime(piVar17->entry);
          set_time_915(puVar32 + 1,tVar10);
          puVar32 = puVar32 + 7;
        }
        if ((bVar19 & 8) != 0) {
          tVar10 = archive_entry_ctime(piVar17->entry);
          set_time_915(puVar32 + 1,tVar10);
          puVar32 = puVar32 + 7;
        }
      }
      isoent = local_60;
      dVar3 = local_6c;
      if ((local_a8.use_extr != 0) &&
         (peVar2 = ((local_a8.isoent)->parent->extr_rec_list).current, peVar2 != (extr_rec *)0x0)) {
        piVar1 = &peVar2->offset;
        *piVar1 = *piVar1 + iVar7;
      }
      local_a8.cur_len = iVar7 + local_a8.cur_len;
      if ((bVar20 & 0x40) != 0) {
        if (local_a8.limit - local_a8.cur_len < 4) {
          puVar32 = extra_next_record(&local_a8,4);
        }
        if (puVar32 == (uchar *)0x0) {
          puVar32 = (uchar *)0x0;
        }
        else {
          builtin_memcpy(puVar32 + 1,"RE\x04\x01",4);
          puVar32 = puVar32 + 4;
        }
        if ((local_a8.use_extr != 0) &&
           (peVar2 = ((local_a8.isoent)->parent->extr_rec_list).current, peVar2 != (extr_rec *)0x0))
        {
          piVar1 = &peVar2->offset;
          *piVar1 = *piVar1 + 4;
        }
        local_a8.cur_len = local_a8.cur_len + 4;
      }
      piVar9 = local_50;
      if ((bVar20 & 0x20) != 0) {
        if (local_a8.limit - local_a8.cur_len < 0xc) {
          puVar32 = extra_next_record(&local_a8,0xc);
        }
        if (puVar32 == (uchar *)0x0) {
          puVar32 = (uchar *)0x0;
        }
        else {
          puVar32[1] = 'P';
          puVar32[2] = 'L';
          puVar32[3] = '\f';
          puVar32[4] = '\x01';
          uVar6 = local_40->dir_location;
          puVar32[5] = (uchar)uVar6;
          uVar28 = (uchar)(uVar6 >> 8);
          puVar32[6] = uVar28;
          uVar16 = (uchar)(uVar6 >> 0x10);
          puVar32[7] = uVar16;
          uVar21 = (uchar)(uVar6 >> 0x18);
          puVar32[8] = uVar21;
          puVar32[9] = uVar21;
          puVar32[10] = uVar16;
          puVar32[0xb] = uVar28;
          puVar32[0xc] = (uchar)uVar6;
          puVar32 = puVar32 + 0xc;
        }
        if ((local_a8.use_extr != 0) &&
           (peVar2 = ((local_a8.isoent)->parent->extr_rec_list).current, peVar2 != (extr_rec *)0x0))
        {
          piVar1 = &peVar2->offset;
          *piVar1 = *piVar1 + 0xc;
        }
        local_a8.cur_len = local_a8.cur_len + 0xc;
      }
      if ((bVar20 & 0x10) != 0) {
        if (local_a8.limit - local_a8.cur_len < 0xc) {
          puVar32 = extra_next_record(&local_a8,0xc);
        }
        if (puVar32 == (uchar *)0x0) {
          puVar32 = (uchar *)0x0;
        }
        else {
          puVar32[1] = 'C';
          puVar32[2] = 'L';
          puVar32[3] = '\f';
          puVar32[4] = '\x01';
          uVar6 = piVar9->rr_child->dir_location;
          puVar32[5] = (uchar)uVar6;
          uVar28 = (uchar)(uVar6 >> 8);
          puVar32[6] = uVar28;
          uVar16 = (uchar)(uVar6 >> 0x10);
          puVar32[7] = uVar16;
          uVar21 = (uchar)(uVar6 >> 0x18);
          puVar32[8] = uVar21;
          puVar32[9] = uVar21;
          puVar32[10] = uVar16;
          puVar32[0xb] = uVar28;
          puVar32[0xc] = (uchar)uVar6;
          puVar32 = puVar32 + 0xc;
        }
        if ((local_a8.use_extr != 0) &&
           (peVar2 = ((local_a8.isoent)->parent->extr_rec_list).current, peVar2 != (extr_rec *)0x0))
        {
          piVar1 = &peVar2->offset;
          *piVar1 = *piVar1 + 0xc;
        }
        local_a8.cur_len = local_a8.cur_len + 0xc;
      }
      if ((bVar20 & 2) != 0) {
        if (local_a8.limit - local_a8.cur_len < 0x14) {
          puVar32 = extra_next_record(&local_a8,0x14);
        }
        if (puVar32 == (uchar *)0x0) {
          puVar32 = (uchar *)0x0;
        }
        else {
          puVar32[1] = 'P';
          puVar32[2] = 'N';
          puVar32[3] = '\x14';
          puVar32[4] = '\x01';
          dVar15 = archive_entry_rdev(piVar17->entry);
          uVar28 = (uchar)(dVar15 >> 0x20);
          puVar32[5] = uVar28;
          uVar16 = (uchar)(dVar15 >> 0x28);
          puVar32[6] = uVar16;
          uVar21 = (uchar)(dVar15 >> 0x30);
          puVar32[7] = uVar21;
          uVar30 = (uchar)(dVar15 >> 0x38);
          puVar32[8] = uVar30;
          puVar32[9] = uVar30;
          puVar32[10] = uVar21;
          puVar32[0xb] = uVar16;
          puVar32[0xc] = uVar28;
          puVar32[0xd] = (uchar)dVar15;
          uVar28 = (uchar)(dVar15 >> 8);
          puVar32[0xe] = uVar28;
          uVar16 = (uchar)(dVar15 >> 0x10);
          puVar32[0xf] = uVar16;
          uVar21 = (uchar)(dVar15 >> 0x18);
          puVar32[0x10] = uVar21;
          puVar32[0x11] = uVar21;
          puVar32[0x12] = uVar16;
          puVar32[0x13] = uVar28;
          puVar32[0x14] = (uchar)dVar15;
          puVar32 = puVar32 + 0x14;
        }
        if ((local_a8.use_extr != 0) &&
           (peVar2 = ((local_a8.isoent)->parent->extr_rec_list).current, peVar2 != (extr_rec *)0x0))
        {
          piVar1 = &peVar2->offset;
          *piVar1 = *piVar1 + 0x14;
        }
        local_a8.cur_len = local_a8.cur_len + 0x14;
      }
      if ((piVar17->zisofs).header_size != '\0') {
        if (local_a8.limit - local_a8.cur_len < 0x10) {
          puVar32 = extra_next_record(&local_a8,0x10);
        }
        if (puVar32 == (uchar *)0x0) {
          puVar32 = (uchar *)0x0;
        }
        else {
          puVar32[1] = 'Z';
          puVar32[2] = 'F';
          puVar32[3] = '\x10';
          puVar32[4] = '\x01';
          puVar32[5] = 'p';
          puVar32[6] = 'z';
          puVar32[7] = (piVar17->zisofs).header_size;
          puVar32[8] = (piVar17->zisofs).log2_bs;
          uVar6 = (piVar17->zisofs).uncompressed_size;
          puVar32[9] = (uchar)uVar6;
          uVar28 = (uchar)(uVar6 >> 8);
          puVar32[10] = uVar28;
          uVar16 = (uchar)(uVar6 >> 0x10);
          puVar32[0xb] = uVar16;
          uVar21 = (uchar)(uVar6 >> 0x18);
          puVar32[0xc] = uVar21;
          puVar32[0xd] = uVar21;
          puVar32[0xe] = uVar16;
          puVar32[0xf] = uVar28;
          puVar32[0x10] = (uchar)uVar6;
          puVar32 = puVar32 + 0x10;
        }
        if ((local_a8.use_extr != 0) &&
           (peVar2 = ((local_a8.isoent)->parent->extr_rec_list).current, peVar2 != (extr_rec *)0x0))
        {
          piVar1 = &peVar2->offset;
          *piVar1 = *piVar1 + 0x10;
        }
        local_a8.cur_len = local_a8.cur_len + 0x10;
      }
      if ((dVar3 == DIR_REC_SELF) && (piVar9 == piVar9->parent)) {
        if (puVar32 != (uchar *)0x0) {
          set_SUSP_CE(puVar32 + 1,local_58->location_rrip_er,0,0xed);
        }
        if ((local_a8.use_extr != 0) &&
           (peVar2 = ((local_a8.isoent)->parent->extr_rec_list).current, peVar2 != (extr_rec *)0x0))
        {
          piVar1 = &peVar2->offset;
          *piVar1 = *piVar1 + 0x1c;
        }
        local_a8.cur_len = local_a8.cur_len + 0x1c;
      }
      extra_close_record(&local_a8,0);
      t = local_6c;
    }
    if (p == (uchar *)0x0) {
      if (t == DIR_REC_NORMAL) {
        (isoent->dr_len).normal = local_a8.dr_len;
        return local_a8.dr_len;
      }
      if (t == DIR_REC_PARENT) {
        (isoent->dr_len).parent = local_a8.dr_len;
        return local_a8.dr_len;
      }
      (isoent->dr_len).self = local_a8.dr_len;
      return local_a8.dr_len;
    }
  }
  *p = (uchar)local_a8.dr_len;
  return local_a8.dr_len;
}

Assistant:

static int
set_directory_record(unsigned char *p, size_t n, struct isoent *isoent,
    struct iso9660 *iso9660, enum dir_rec_type t,
    enum vdd_type vdd_type)
{
	unsigned char *bp;
	size_t dr_len;
	size_t fi_len;

	if (p != NULL) {
		/*
		 * Check whether a write buffer size is less than the
		 * saved size which is needed to write this Directory
		 * Record.
		 */
		switch (t) {
		case DIR_REC_VD:
			dr_len = isoent->dr_len.vd; break;
		case DIR_REC_SELF:
			dr_len = isoent->dr_len.self; break;
		case DIR_REC_PARENT:
			dr_len = isoent->dr_len.parent; break;
		case DIR_REC_NORMAL:
		default:
			dr_len = isoent->dr_len.normal; break;
		}
		if (dr_len > n)
			return (0);/* Needs more buffer size. */
	}

	if (t == DIR_REC_NORMAL && isoent->identifier != NULL)
		fi_len = isoent->id_len;
	else
		fi_len = 1;

	if (p != NULL) {
		struct isoent *xisoent;
		struct isofile *file;
		unsigned char flag;

		if (t == DIR_REC_PARENT)
			xisoent = isoent->parent;
		else
			xisoent = isoent;
		file = isoent->file;
		if (file->hardlink_target != NULL)
			file = file->hardlink_target;
		/* Make a file flag. */
		if (xisoent->dir)
			flag = FILE_FLAG_DIRECTORY;
		else {
			if (file->cur_content->next != NULL)
				flag = FILE_FLAG_MULTI_EXTENT;
			else
				flag = 0;
		}

		bp = p -1;
		/* Extended Attribute Record Length */
		set_num_711(bp+2, 0);
		/* Location of Extent */
		if (xisoent->dir)
			set_num_733(bp+3, xisoent->dir_location);
		else
			set_num_733(bp+3, file->cur_content->location);
		/* Data Length */
		if (xisoent->dir)
			set_num_733(bp+11,
			    xisoent->dir_block * LOGICAL_BLOCK_SIZE);
		else
			set_num_733(bp+11, (uint32_t)file->cur_content->size);
		/* Recording Date and Time */
		/* NOTE:
		 *  If a file type is symbolic link, you are seeing this
		 *  field value is different from a value mkisofs makes.
		 *  libarchive uses lstat to get this one, but it
		 *  seems mkisofs uses stat to get.
		 */
		set_time_915(bp+19,
		    archive_entry_mtime(xisoent->file->entry));
		/* File Flags */
		bp[26] = flag;
		/* File Unit Size */
		set_num_711(bp+27, 0);
		/* Interleave Gap Size */
		set_num_711(bp+28, 0);
		/* Volume Sequence Number */
		set_num_723(bp+29, iso9660->volume_sequence_number);
		/* Length of File Identifier */
		set_num_711(bp+33, (unsigned char)fi_len);
		/* File Identifier */
		switch (t) {
		case DIR_REC_VD:
		case DIR_REC_SELF:
			set_num_711(bp+34, 0);
			break;
		case DIR_REC_PARENT:
			set_num_711(bp+34, 1);
			break;
		case DIR_REC_NORMAL:
			if (isoent->identifier != NULL)
				memcpy(bp+34, isoent->identifier, fi_len);
			else
				set_num_711(bp+34, 0);
			break;
		}
	} else
		bp = NULL;
	dr_len = 33 + fi_len;
	/* Padding Field */
	if (dr_len & 0x01) {
		dr_len ++;
		if (p != NULL)
			bp[dr_len] = 0;
	}

	/* Volume Descriptor does not record extension. */
	if (t == DIR_REC_VD) {
		if (p != NULL)
			/* Length of Directory Record */
			set_num_711(p, (unsigned char)dr_len);
		else
			isoent->dr_len.vd = (int)dr_len;
		return ((int)dr_len);
	}

	/* Rockridge */
	if (iso9660->opt.rr && vdd_type != VDD_JOLIET)
		dr_len = set_directory_record_rr(bp, (int)dr_len,
		    isoent, iso9660, t);

	if (p != NULL)
		/* Length of Directory Record */
		set_num_711(p, (unsigned char)dr_len);
	else {
		/*
		 * Save the size which is needed to write this
		 * Directory Record.
		 */
		switch (t) {
		case DIR_REC_VD:
			/* This case does not come, but compiler
			 * complains that DIR_REC_VD not handled
			 *  in switch ....  */
			break;
		case DIR_REC_SELF:
			isoent->dr_len.self = (int)dr_len; break;
		case DIR_REC_PARENT:
			isoent->dr_len.parent = (int)dr_len; break;
		case DIR_REC_NORMAL:
			isoent->dr_len.normal = (int)dr_len; break;
		}
	}

	return ((int)dr_len);
}